

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O2

void unpackforblock4(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  uint32_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  puVar1 = (ulong *)*pw;
  puVar2 = *pout;
  uVar3 = *puVar1;
  uVar4 = puVar1[1];
  *pw = (uint8_t *)(puVar1 + 2);
  *puVar2 = ((uint)uVar3 & 0xf) + base;
  puVar2[1] = ((uint)(uVar3 >> 4) & 0xf) + base;
  puVar2[2] = ((uint)(uVar3 >> 8) & 0xf) + base;
  puVar2[3] = ((uint)(uVar3 >> 0xc) & 0xf) + base;
  puVar2[4] = ((uint)(uVar3 >> 0x10) & 0xf) + base;
  puVar2[5] = ((uint)(uVar3 >> 0x14) & 0xf) + base;
  puVar2[6] = ((uint)(uVar3 >> 0x18) & 0xf) + base;
  puVar2[7] = ((uint)(uVar3 >> 0x1c) & 0xf) + base;
  uVar5 = (uint)(uVar3 >> 0x20);
  puVar2[8] = (uVar5 & 0xf) + base;
  puVar2[9] = (uVar5 >> 4 & 0xf) + base;
  puVar2[10] = (uVar5 >> 8 & 0xf) + base;
  puVar2[0xb] = (uVar5 >> 0xc & 0xf) + base;
  puVar2[0xc] = ((ushort)(uVar3 >> 0x30) & 0xf) + base;
  puVar2[0xd] = (uVar5 >> 0x14 & 0xf) + base;
  puVar2[0xe] = ((byte)(uVar3 >> 0x38) & 0xf) + base;
  puVar2[0xf] = (uVar5 >> 0x1c) + base;
  puVar2[0x10] = ((uint)uVar4 & 0xf) + base;
  puVar2[0x11] = ((uint)(uVar4 >> 4) & 0xf) + base;
  puVar2[0x12] = ((uint)(uVar4 >> 8) & 0xf) + base;
  puVar2[0x13] = ((uint)(uVar4 >> 0xc) & 0xf) + base;
  puVar2[0x14] = ((uint)(uVar4 >> 0x10) & 0xf) + base;
  puVar2[0x15] = ((uint)(uVar4 >> 0x14) & 0xf) + base;
  puVar2[0x16] = ((uint)(uVar4 >> 0x18) & 0xf) + base;
  puVar2[0x17] = ((uint)(uVar4 >> 0x1c) & 0xf) + base;
  uVar5 = (uint)(uVar4 >> 0x20);
  puVar2[0x18] = (uVar5 & 0xf) + base;
  puVar2[0x19] = (uVar5 >> 4 & 0xf) + base;
  puVar2[0x1a] = (uVar5 >> 8 & 0xf) + base;
  puVar2[0x1b] = (uVar5 >> 0xc & 0xf) + base;
  puVar2[0x1c] = ((ushort)(uVar4 >> 0x30) & 0xf) + base;
  puVar2[0x1d] = (uVar5 >> 0x14 & 0xf) + base;
  puVar2[0x1e] = ((byte)(uVar4 >> 0x38) & 0xf) + base;
  puVar2[0x1f] = (uVar5 >> 0x1c) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock4(const uint32_t base, const uint8_t **pw,
                            uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(15);
  /* we are going to access  2 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  *pw += 16; /* we used up 16 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 4) & mask);
  out[2] = base + (uint32_t)((w0 >> 8) & mask);
  out[3] = base + (uint32_t)((w0 >> 12) & mask);
  out[4] = base + (uint32_t)((w0 >> 16) & mask);
  out[5] = base + (uint32_t)((w0 >> 20) & mask);
  out[6] = base + (uint32_t)((w0 >> 24) & mask);
  out[7] = base + (uint32_t)((w0 >> 28) & mask);
  out[8] = base + (uint32_t)((w0 >> 32) & mask);
  out[9] = base + (uint32_t)((w0 >> 36) & mask);
  out[10] = base + (uint32_t)((w0 >> 40) & mask);
  out[11] = base + (uint32_t)((w0 >> 44) & mask);
  out[12] = base + (uint32_t)((w0 >> 48) & mask);
  out[13] = base + (uint32_t)((w0 >> 52) & mask);
  out[14] = base + (uint32_t)((w0 >> 56) & mask);
  out[15] = base + (uint32_t)(w0 >> 60);
  out[16] = base + (uint32_t)((w1)&mask);
  out[17] = base + (uint32_t)((w1 >> 4) & mask);
  out[18] = base + (uint32_t)((w1 >> 8) & mask);
  out[19] = base + (uint32_t)((w1 >> 12) & mask);
  out[20] = base + (uint32_t)((w1 >> 16) & mask);
  out[21] = base + (uint32_t)((w1 >> 20) & mask);
  out[22] = base + (uint32_t)((w1 >> 24) & mask);
  out[23] = base + (uint32_t)((w1 >> 28) & mask);
  out[24] = base + (uint32_t)((w1 >> 32) & mask);
  out[25] = base + (uint32_t)((w1 >> 36) & mask);
  out[26] = base + (uint32_t)((w1 >> 40) & mask);
  out[27] = base + (uint32_t)((w1 >> 44) & mask);
  out[28] = base + (uint32_t)((w1 >> 48) & mask);
  out[29] = base + (uint32_t)((w1 >> 52) & mask);
  out[30] = base + (uint32_t)((w1 >> 56) & mask);
  out[31] = base + (uint32_t)(w1 >> 60);
  *pout += 32; /* we wrote 32 32-bit integers */
}